

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

void __thiscall Json::OurCharReader::OurImpl::~OurImpl(OurImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Impl)._vptr_Impl = (_func_int **)&PTR__OurImpl_00150b80;
  pcVar2 = (this->reader_).commentsBefore_._M_dataplus._M_p;
  paVar1 = &(this->reader_).commentsBefore_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->reader_).document_._M_dataplus._M_p;
  paVar1 = &(this->reader_).document_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::~deque
            (&(this->reader_).errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&this->reader_);
  return;
}

Assistant:

OurImpl(bool collectComments, OurFeatures const& features)
        : collectComments_(collectComments), reader_(features) {}